

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slot.cpp
# Opt level: O0

void __thiscall
Slot::Slot(Slot *this,ObjectStore *inObjectStore,CK_SLOT_ID inSlotID,ObjectStoreToken *inToken)

{
  void *pvVar1;
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Token *in_stack_ffffffffffffffc0;
  
  *in_RDI = &PTR__Slot_00223d58;
  in_RDI[1] = in_RSI;
  in_RDI[3] = in_RDX;
  if (in_RCX == 0) {
    pvVar1 = operator_new(0x28);
    Token::Token(in_stack_ffffffffffffffc0);
    in_RDI[2] = pvVar1;
  }
  else {
    pvVar1 = operator_new(0x28);
    Token::Token((Token *)inSlotID,inToken);
    in_RDI[2] = pvVar1;
  }
  return;
}

Assistant:

Slot::Slot(ObjectStore* inObjectStore, CK_SLOT_ID inSlotID, ObjectStoreToken* inToken /* = NULL */)
{
	objectStore = inObjectStore;
	slotID = inSlotID;

	if (inToken != NULL)
	{
		token = new Token(inToken);
	}
	else
	{
		token = new Token();
	}
}